

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
* __thiscall
llvm::DWARFDebugNames::NameIndex::extractAttributeEncodings
          (Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
           *__return_storage_ptr__,NameIndex *this,uint64_t *Offset)

{
  storage_type *psVar1;
  undefined1 auStack_68 [8];
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  Result;
  undefined1 local_48 [8];
  Expected<llvm::DWARFDebugNames::AttributeEncoding> AttrEncOr;
  
  auStack_68 = (undefined1  [8])0x0;
  Result.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Result.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    extractAttributeEncoding((NameIndex *)local_48,(uint64_t *)this);
    if ((AttrEncOr.field_0.TStorage.buffer[0] & 1U) != 0) {
      Expected<llvm::DWARFDebugNames::AttributeEncoding>::takeError
                ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)&AttrEncOr.field_0x8);
      Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
      ::Expected(__return_storage_ptr__,(Error *)&AttrEncOr.field_0x8);
      if ((long *)(AttrEncOr._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(AttrEncOr._8_8_ & 0xfffffffffffffffe) + 8))();
      }
LAB_00b1bc0a:
      Expected<llvm::DWARFDebugNames::AttributeEncoding>::~Expected
                ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
      std::
      _Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
      ::~_Vector_base((_Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                       *)auStack_68);
      return __return_storage_ptr__;
    }
    psVar1 = Expected<llvm::DWARFDebugNames::AttributeEncoding>::getStorage
                       ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
    if ((psVar1->Index == 0) && (psVar1->Form == 0)) {
      Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>>
      ::
      Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>>
                ((Expected<std::vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>>
                  *)__return_storage_ptr__,
                 (vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                  *)auStack_68,(type *)0x0);
      goto LAB_00b1bc0a;
    }
    psVar1 = Expected<llvm::DWARFDebugNames::AttributeEncoding>::getStorage
                       ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
    std::
    vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>
    ::emplace_back<llvm::DWARFDebugNames::AttributeEncoding&>
              ((vector<llvm::DWARFDebugNames::AttributeEncoding,std::allocator<llvm::DWARFDebugNames::AttributeEncoding>>
                *)auStack_68,psVar1);
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::~Expected
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)local_48);
  } while( true );
}

Assistant:

Expected<std::vector<DWARFDebugNames::AttributeEncoding>>
DWARFDebugNames::NameIndex::extractAttributeEncodings(uint64_t *Offset) {
  std::vector<AttributeEncoding> Result;
  for (;;) {
    auto AttrEncOr = extractAttributeEncoding(Offset);
    if (!AttrEncOr)
      return AttrEncOr.takeError();
    if (isSentinel(*AttrEncOr))
      return std::move(Result);

    Result.emplace_back(*AttrEncOr);
  }
}